

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# backward_references_hq.c
# Opt level: O1

size_t ComputeShortestPathFromNodes(size_t num_bytes,ZopfliNode *nodes)

{
  ZopfliNode *pZVar1;
  uint32_t uVar2;
  size_t sVar3;
  uint uVar4;
  
  uVar2 = nodes[num_bytes].insert_length;
  for (pZVar1 = nodes + num_bytes; (uVar2 == 0 && (pZVar1->length == 1)); pZVar1 = pZVar1 + -1) {
    num_bytes = num_bytes - 1;
    uVar2 = pZVar1[-1].insert_length;
  }
  (pZVar1->u).next = 0xffffffff;
  sVar3 = 0;
  while (num_bytes != 0) {
    uVar4 = (nodes[num_bytes].length & 0xffffff) + nodes[num_bytes].insert_length;
    num_bytes = num_bytes - uVar4;
    nodes[num_bytes].u.next = uVar4;
    sVar3 = sVar3 + 1;
  }
  return sVar3;
}

Assistant:

static size_t ComputeShortestPathFromNodes(size_t num_bytes,
    ZopfliNode* nodes) {
  size_t index = num_bytes;
  size_t num_commands = 0;
  while (nodes[index].insert_length == 0 && nodes[index].length == 1) --index;
  nodes[index].u.next = BROTLI_UINT32_MAX;
  while (index != 0) {
    size_t len = ZopfliNodeCommandLength(&nodes[index]);
    index -= len;
    nodes[index].u.next = (uint32_t)len;
    num_commands++;
  }
  return num_commands;
}